

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MergeRowidLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  int iVar1;
  undefined1 local_50 [8];
  Fts5Buffer out;
  i64 iOut;
  i64 iRowid2;
  i64 iRowid1;
  int i2;
  int i1;
  Fts5Buffer *p2_local;
  Fts5Buffer *p1_local;
  Fts5Index *p_local;
  
  iRowid1._4_4_ = 0;
  iRowid1._0_4_ = 0;
  iRowid2 = 0;
  iOut = 0;
  out.n = 0;
  out.nSpace = 0;
  _i2 = p2;
  p2_local = p1;
  p1_local = (Fts5Buffer *)p;
  memset(local_50,0,0x10);
  sqlite3Fts5BufferSize
            ((int *)((long)&p1_local[3].p + 4),(Fts5Buffer *)local_50,p2_local->n + _i2->n);
  if (*(int *)((long)&p1_local[3].p + 4) == 0) {
    fts5NextRowid(p2_local,(int *)((long)&iRowid1 + 4),&iRowid2);
    fts5NextRowid(_i2,(int *)&iRowid1,&iOut);
    while (-1 < iRowid1._4_4_ || -1 < (int)iRowid1) {
      if ((iRowid1._4_4_ < 0) || ((-1 < (int)iRowid1 && (iOut <= iRowid2)))) {
        iVar1 = sqlite3Fts5PutVarint((uchar *)((long)local_50 + (long)(int)out.p),iOut - out._8_8_);
        out.p._0_4_ = iVar1 + (int)out.p;
        out.n = (undefined4)iOut;
        out.nSpace = iOut._4_4_;
        if ((-1 < iRowid1._4_4_) && (iRowid2 == iOut)) {
          fts5NextRowid(p2_local,(int *)((long)&iRowid1 + 4),&iRowid2);
        }
        fts5NextRowid(_i2,(int *)&iRowid1,&iOut);
      }
      else {
        iVar1 = sqlite3Fts5PutVarint
                          ((uchar *)((long)local_50 + (long)(int)out.p),iRowid2 - out._8_8_);
        out.p._0_4_ = iVar1 + (int)out.p;
        out.n = (undefined4)iRowid2;
        out.nSpace = iRowid2._4_4_;
        fts5NextRowid(p2_local,(int *)((long)&iRowid1 + 4),&iRowid2);
      }
    }
    fts5BufferSwap((Fts5Buffer *)local_50,p2_local);
    sqlite3Fts5BufferFree((Fts5Buffer *)local_50);
  }
  return;
}

Assistant:

static void fts5MergeRowidLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  int i1 = 0;
  int i2 = 0;
  i64 iRowid1 = 0;
  i64 iRowid2 = 0;
  i64 iOut = 0;

  Fts5Buffer out;
  memset(&out, 0, sizeof(out));
  sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n);
  if( p->rc ) return;

  fts5NextRowid(p1, &i1, &iRowid1);
  fts5NextRowid(p2, &i2, &iRowid2);
  while( i1>=0 || i2>=0 ){
    if( i1>=0 && (i2<0 || iRowid1<iRowid2) ){
      assert( iOut==0 || iRowid1>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid1 - iOut);
      iOut = iRowid1;
      fts5NextRowid(p1, &i1, &iRowid1);
    }else{
      assert( iOut==0 || iRowid2>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid2 - iOut);
      iOut = iRowid2;
      if( i1>=0 && iRowid1==iRowid2 ){
        fts5NextRowid(p1, &i1, &iRowid1);
      }
      fts5NextRowid(p2, &i2, &iRowid2);
    }
  }

  fts5BufferSwap(&out, p1);
  fts5BufferFree(&out);
}